

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

int64_t __thiscall transwarp::node::get_avg_runtime_us(node *this)

{
  node *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (this->avg_runtime_us_).super___atomic_base<long>._M_i;
}

Assistant:

std::int64_t get_avg_runtime_us() const noexcept {
        return avg_runtime_us_.load();
    }